

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

ssize_t __thiscall
kj::AsyncIoStreamWithGuards::write(AsyncIoStreamWithGuards *this,int __fd,void *__buf,size_t __n)

{
  undefined4 in_register_00000034;
  ArrayPtr<const_unsigned_char> *pAVar1;
  anon_class_24_2_4df0a340_for_func aStack_48;
  size_t local_30;
  
  pAVar1 = (ArrayPtr<const_unsigned_char> *)CONCAT44(in_register_00000034,__fd);
  if (*(undefined1 *)((long)&pAVar1[4].size_ + 1) == '\x01') {
    (**(code **)(*(long *)(pAVar1[2].ptr + 8) + 8))(this,pAVar1[2].ptr + 8,__buf,__n);
  }
  else {
    ForkedPromise<void>::addBranch((ForkedPromise<void> *)&aStack_48);
    aStack_48.pieces.ptr = pAVar1;
    aStack_48.pieces.size_ = (size_t)__buf;
    local_30 = __n;
    Promise<void>::
    then<kj::AsyncIoStreamWithGuards::write(kj::ArrayPtr<kj::ArrayPtr<unsigned_char_const>const>)::_lambda()_1_>
              ((Promise<void> *)this,&aStack_48);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&aStack_48);
  }
  return (ssize_t)this;
}

Assistant:

Promise<void> write(ArrayPtr<const ArrayPtr<const byte>> pieces) override {
    if (writeGuardReleased) {
      return inner->write(pieces);
    } else {
      return writeGuard.addBranch().then([this, pieces]() {
        return inner->write(pieces);
      });
    }
  }